

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cCopyImageTests.cpp
# Opt level: O2

IterateResult __thiscall
gl4cts::CopyImage::IncompatibleFormatsCompressionTest::iterate
          (IncompatibleFormatsCompressionTest *this)

{
  ostringstream *this_00;
  GLenum GVar1;
  int iVar2;
  GLuint GVar3;
  GLenum GVar4;
  IterateResult IVar5;
  undefined4 extraout_var;
  uint uVar6;
  pointer ptVar7;
  GLuint temp;
  Enum<int,_2UL> local_1f8;
  Enum<int,_2UL> local_1e8;
  Enum<int,_2UL> local_1d8;
  Enum<int,_2UL> local_1c8;
  Enum<int,_2UL> local_1b8;
  undefined1 local_1a8 [384];
  
  iVar2 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  temp = 0;
  uVar6 = this->m_test_case_index;
  ptVar7 = (this->m_test_cases).
           super__Vector_base<gl4cts::CopyImage::IncompatibleFormatsCompressionTest::testCase,_std::allocator<gl4cts::CopyImage::IncompatibleFormatsCompressionTest::testCase>_>
           ._M_impl.super__Vector_impl_data._M_start;
  GVar3 = Utils::prepareTex16x16x6
                    ((this->super_TestCase).m_context,ptVar7[uVar6].m_tex_target,
                     ptVar7[uVar6].m_dst_internal_format,ptVar7[uVar6].m_dst_format,
                     ptVar7[uVar6].m_dst_type,&temp);
  ptVar7 = ptVar7 + uVar6;
  this->m_dst_tex_name = GVar3;
  GVar3 = Utils::prepareTex16x16x6
                    ((this->super_TestCase).m_context,ptVar7->m_tex_target,
                     ptVar7->m_src_internal_format,ptVar7->m_src_format,ptVar7->m_src_type,&temp);
  this->m_src_tex_name = GVar3;
  Utils::makeTextureComplete
            ((this->super_TestCase).m_context,ptVar7->m_tex_target,this->m_dst_tex_name,0,0);
  Utils::makeTextureComplete
            ((this->super_TestCase).m_context,ptVar7->m_tex_target,this->m_src_tex_name,0,0);
  (**(code **)(CONCAT44(extraout_var,iVar2) + 0x310))
            (this->m_src_tex_name,ptVar7->m_tex_target,0,0,0,0,this->m_dst_tex_name,
             ptVar7->m_tex_target,0,0,0,0,4,4,1);
  GVar4 = (**(code **)(CONCAT44(extraout_var,iVar2) + 0x800))();
  GVar1 = ptVar7->m_expected_result;
  clean(this);
  if (GVar1 == GVar4) {
    tcu::TestContext::setTestResult
              (((this->super_TestCase).m_context)->m_testCtx,QP_TEST_RESULT_PASS,"Pass");
    uVar6 = this->m_test_case_index + 1;
    this->m_test_case_index = uVar6;
    IVar5 = (IterateResult)
            ((ulong)uVar6 <
            (ulong)((long)(this->m_test_cases).
                          super__Vector_base<gl4cts::CopyImage::IncompatibleFormatsCompressionTest::testCase,_std::allocator<gl4cts::CopyImage::IncompatibleFormatsCompressionTest::testCase>_>
                          ._M_impl.super__Vector_impl_data._M_finish -
                    (long)(this->m_test_cases).
                          super__Vector_base<gl4cts::CopyImage::IncompatibleFormatsCompressionTest::testCase,_std::allocator<gl4cts::CopyImage::IncompatibleFormatsCompressionTest::testCase>_>
                          ._M_impl.super__Vector_impl_data._M_start >> 5));
  }
  else {
    local_1a8._0_8_ = ((this->super_TestCase).m_context)->m_testCtx->m_log;
    this_00 = (ostringstream *)(local_1a8 + 8);
    std::__cxx11::ostringstream::ostringstream(this_00);
    std::operator<<((ostream *)this_00,"Failure. Expected result: ");
    local_1b8.m_value = ptVar7->m_expected_result;
    local_1b8.m_getName = glu::getErrorName;
    tcu::Format::Enum<int,_2UL>::toStream(&local_1b8,(ostream *)this_00);
    std::operator<<((ostream *)this_00," got: ");
    local_1c8.m_getName = glu::getErrorName;
    local_1c8.m_value = GVar4;
    tcu::Format::Enum<int,_2UL>::toStream(&local_1c8,(ostream *)this_00);
    std::operator<<((ostream *)this_00,". Texture target: ");
    local_1d8.m_value = ptVar7->m_tex_target;
    local_1d8.m_getName = glu::getTextureTargetName;
    tcu::Format::Enum<int,_2UL>::toStream(&local_1d8,(ostream *)this_00);
    std::operator<<((ostream *)this_00,". Source format: ");
    local_1e8.m_value = ptVar7->m_src_internal_format;
    local_1e8.m_getName = glu::getInternalFormatParameterName;
    tcu::Format::Enum<int,_2UL>::toStream(&local_1e8,(ostream *)this_00);
    std::operator<<((ostream *)this_00,". Destination format: ");
    local_1f8.m_value = ptVar7->m_dst_internal_format;
    local_1f8.m_getName = glu::getInternalFormatParameterName;
    tcu::Format::Enum<int,_2UL>::toStream(&local_1f8,(ostream *)this_00);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1a8,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(this_00);
    tcu::TestContext::setTestResult
              (((this->super_TestCase).m_context)->m_testCtx,QP_TEST_RESULT_FAIL,"Fail");
    IVar5 = STOP;
  }
  return IVar5;
}

Assistant:

tcu::TestNode::IterateResult IncompatibleFormatsCompressionTest::iterate()
{
	GLenum						 error	 = GL_NO_ERROR;
	const Functions&			 gl		   = m_context.getRenderContext().getFunctions();
	tcu::TestNode::IterateResult it_result = tcu::TestNode::STOP;
	bool						 result	= false;
	GLuint						 temp	  = 0;
	const testCase&				 test_case = m_test_cases[m_test_case_index];

	try
	{
		/* Prepare textures */
		m_dst_tex_name = Utils::prepareTex16x16x6(m_context, test_case.m_tex_target, test_case.m_dst_internal_format,
												  test_case.m_dst_format, test_case.m_dst_type, temp);
		m_src_tex_name = Utils::prepareTex16x16x6(m_context, test_case.m_tex_target, test_case.m_src_internal_format,
												  test_case.m_src_format, test_case.m_src_type, temp);

		/* Make textures complete */
		Utils::makeTextureComplete(m_context, test_case.m_tex_target, m_dst_tex_name, 0 /* base */, 0 /* max */);
		Utils::makeTextureComplete(m_context, test_case.m_tex_target, m_src_tex_name, 0 /* base */, 0 /* max */);
	}
	catch (tcu::Exception& exc)
	{
		clean();
		throw exc;
	}

	/* Execute CopyImageSubData */
	gl.copyImageSubData(m_src_tex_name, test_case.m_tex_target, 0 /* srcLevel */, 0 /* srcX */, 0 /* srcY */,
						0 /* srcZ */, m_dst_tex_name, test_case.m_tex_target, 0 /* dstLevel */, 0 /* dstX */,
						0 /* dstY */, 0 /* dstZ */, 4 /* srcWidth */, 4 /* srcHeight */, 1 /* srcDepth */);

	/* Verify generated error */
	error  = gl.getError();
	result = (test_case.m_expected_result == error);

	/* Remove resources */
	clean();

	if (true == result)
	{
		m_context.getTestContext().setTestResult(QP_TEST_RESULT_PASS, "Pass");

		/* Increase index */
		m_test_case_index += 1;

		/* Are there any test cases left */
		if (m_test_cases.size() > m_test_case_index)
		{
			it_result = tcu::TestNode::CONTINUE;
		}
	}
	else
	{
		m_context.getTestContext().getLog()
			<< tcu::TestLog::Message << "Failure. Expected result: " << glu::getErrorStr(test_case.m_expected_result)
			<< " got: " << glu::getErrorStr(error)
			<< ". Texture target: " << glu::getTextureTargetStr(test_case.m_tex_target)
			<< ". Source format: " << glu::getInternalFormatParameterStr(test_case.m_src_internal_format)
			<< ". Destination format: " << glu::getInternalFormatParameterStr(test_case.m_dst_internal_format)
			<< tcu::TestLog::EndMessage;

		m_context.getTestContext().setTestResult(QP_TEST_RESULT_FAIL, "Fail");
	}

	/* Done */
	return it_result;
}